

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ImageTests::~ImageTests(ImageTests *this)

{
  ~ImageTests(this);
  operator_delete(this,0x680);
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}